

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O2

void __thiscall FIX::DataDictionary::checkValidFormat(DataDictionary *this,FieldBase *field)

{
  Type type;
  UtcTimeOnly local_60;
  UtcDate local_48;
  UtcTimeStamp local_30;
  
  type = Unknown;
  getFieldType(this,field->m_tag,&type);
  switch(type) {
  case Char:
    CharConvertor::convert(&field->m_string);
    break;
  case Price:
  case Amt:
  case Qty:
  case Float:
  case PriceOffset:
  case Percentage:
    DoubleConvertor::convert(&field->m_string);
    break;
  case Int:
  case NumInGroup:
  case TagNum:
  case Length:
    IntTConvertor<int>::convert(&field->m_string);
    break;
  case UtcTimeStamp:
    UtcTimeStampConvertor::convert(&local_30,&field->m_string);
    break;
  case Boolean:
    BoolConvertor::convert(&field->m_string);
    break;
  case UtcDate:
    UtcDateConvertor::convert(&local_48,&field->m_string);
    break;
  case UtcTimeOnly:
    UtcTimeOnlyConvertor::convert(&local_60,&field->m_string);
    break;
  case SeqNum:
    IntTConvertor<unsigned_long>::convert(&field->m_string);
  }
  return;
}

Assistant:

EXCEPT(IncorrectDataFormat) {
    try {
      TYPE::Type type = TYPE::Unknown;
      getFieldType(field.getTag(), type);
      switch (type) {
      case TYPE::String:
        STRING_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Char:
        CHAR_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Price:
        PRICE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Int:
        INT_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Amt:
        AMT_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Qty:
        QTY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Currency:
        CURRENCY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::MultipleValueString:
        MULTIPLEVALUESTRING_CONVERTOR::convert(field.getString());
        break;
      case TYPE::MultipleStringValue:
        MULTIPLESTRINGVALUE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::MultipleCharValue:
        MULTIPLECHARVALUE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Exchange:
        EXCHANGE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::UtcTimeStamp:
        UTCTIMESTAMP_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Boolean:
        BOOLEAN_CONVERTOR::convert(field.getString());
        break;
      case TYPE::LocalMktTime:
        LOCALMKTTIME_CONVERTOR::convert(field.getString());
        break;
      case TYPE::LocalMktDate:
        LOCALMKTDATE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Data:
        DATA_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Float:
        FLOAT_CONVERTOR::convert(field.getString());
        break;
      case TYPE::PriceOffset:
        PRICEOFFSET_CONVERTOR::convert(field.getString());
        break;
      case TYPE::MonthYear:
        MONTHYEAR_CONVERTOR::convert(field.getString());
        break;
      case TYPE::DayOfMonth:
        DAYOFMONTH_CONVERTOR::convert(field.getString());
        break;
      case TYPE::UtcDate:
        UTCDATE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::UtcTimeOnly:
        UTCTIMEONLY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::NumInGroup:
        NUMINGROUP_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Percentage:
        PERCENTAGE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::SeqNum:
        SEQNUM_CONVERTOR::convert(field.getString());
        break;
      case TYPE::TagNum:
        TAGNUM_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Length:
        LENGTH_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Country:
        COUNTRY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::TzTimeOnly:
        TZTIMEONLY_CONVERTOR::convert(field.getString());
        break;
      case TYPE::TzTimeStamp:
        TZTIMESTAMP_CONVERTOR::convert(field.getString());
        break;
      case TYPE::XmlData:
        XMLDATA_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Language:
        LANGUAGE_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Xid:
        XID_CONVERTOR::convert(field.getString());
        break;
      case TYPE::XidRef:
        XIDREF_CONVERTOR::convert(field.getString());
        break;
      case TYPE::Unknown:
        break;
      }
    } catch (FieldConvertError &) {
      throw IncorrectDataFormat(field.getTag(), field.getString());
    }
  }